

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_file.c
# Opt level: O2

ion_file_handle_t ion_fopen(char *name)

{
  FILE *pFVar1;
  
  pFVar1 = fopen(name,"r+b");
  if (pFVar1 != (FILE *)0x0) {
    return (ion_file_handle_t)pFVar1;
  }
  pFVar1 = fopen(name,"w+b");
  return (ion_file_handle_t)pFVar1;
}

Assistant:

ion_file_handle_t
ion_fopen(
	char *name
) {
#if defined(ARDUINO)

	ion_file_handle_t toret;

	toret.file = fopen(name, "r+");

	if (NULL == toret.file) {
		toret.file = fopen(name, "w+");
	}

	return toret;
#else

	ion_file_handle_t file;

	file = fopen(name, "r+b");

	if (NULL == file) {
		file = fopen(name, "w+b");
	}

	return file;
#endif
}